

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_connect(connectdata *conn,_Bool *done)

{
  pingpong *pp;
  imap_conn *imapc;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  (conn->bits).close = false;
  (conn->proto).ftpc.pp.response_time = 1800000;
  (conn->proto).ftpc.pp.statemach_act = imap_statemach_act;
  (conn->proto).ftpc.pp.endofresp = imap_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  (conn->proto).imapc.preftype = 0xffffffff;
  Curl_sasl_init(&(conn->proto).imapc.sasl,&saslimap);
  Curl_pp_init(&(conn->proto).ftpc.pp);
  conn_local._4_4_ = imap_parse_url_options(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    state(conn,IMAP_SERVERGREET);
    strcpy(&(conn->proto).ftpc.transfertype,"*");
    conn_local._4_4_ = imap_multi_statemach(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in IMAP */
  connkeep(conn, "IMAP default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = imap_statemach_act;
  pp->endofresp = imap_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  imapc->preftype = IMAP_TYPE_ANY;
  Curl_sasl_init(&imapc->sasl, &saslimap);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = imap_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, IMAP_SERVERGREET);

  /* Start off with an response id of '*' */
  strcpy(imapc->resptag, "*");

  result = imap_multi_statemach(conn, done);

  return result;
}